

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.h
# Opt level: O1

CutResult QtPrivate::QContainerImplHelper::mid
                    (qsizetype originalLength,qsizetype *_position,qsizetype *_length)

{
  ulong uVar1;
  CutResult CVar2;
  long lVar3;
  
  lVar3 = *_position;
  if (originalLength < lVar3) {
    CVar2 = Null;
    *_position = 0;
    *_length = 0;
  }
  else {
    uVar1 = *_length;
    if (lVar3 < 0) {
      if (((long)uVar1 < 0) || (lVar3 = uVar1 + lVar3, originalLength <= lVar3)) {
        *_position = 0;
        *_length = originalLength;
        return Full;
      }
      if (lVar3 < 1) {
        *_length = 0;
        *_position = 0;
        return Null;
      }
      *_length = lVar3;
      *_position = 0;
    }
    else if ((ulong)(originalLength - lVar3) < uVar1) {
      *_length = originalLength - lVar3;
    }
    if ((*_position != 0) || (CVar2 = Full, *_length != originalLength)) {
      return (uint)(0 < *_length) * 2 + Empty;
    }
  }
  return CVar2;
}

Assistant:

static constexpr CutResult mid(qsizetype originalLength, qsizetype *_position, qsizetype *_length)
    {
        qsizetype &position = *_position;
        qsizetype &length = *_length;
        if (position > originalLength) {
            position = 0;
            length = 0;
            return Null;
        }

        if (position < 0) {
            if (length < 0 || length + position >= originalLength) {
                position = 0;
                length = originalLength;
                return Full;
            }
            if (length + position <= 0) {
                position = length = 0;
                return Null;
            }
            length += position;
            position = 0;
        } else if (size_t(length) > size_t(originalLength - position)) {
            length = originalLength - position;
        }

        if (position == 0 && length == originalLength)
            return Full;

        return length > 0 ? Subset : Empty;
    }